

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O1

int __thiscall MeCab::Mmap<short>::open(Mmap<short> *this,char *__file,int __oflag,...)

{
  int iVar1;
  ostream *poVar2;
  short *psVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  whatlog *pwVar7;
  stat st;
  allocator local_b1;
  stat local_b0;
  
  close(this,(int)__file);
  std::__cxx11::string::string((string *)&local_b0,__file,&local_b1);
  std::__cxx11::string::operator=((string *)&this->fileName,(string *)&local_b0);
  if ((__nlink_t *)local_b0.st_dev != &local_b0.st_nlink) {
    operator_delete((void *)local_b0.st_dev);
  }
  iVar1 = strcmp(___oflag,"r");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(___oflag,"r+");
    if (iVar1 != 0) {
      pwVar7 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar7,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)pwVar7,0x9a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"false",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      pcVar6 = "unknown open mode: ";
      lVar5 = 0x13;
      goto LAB_0015b061;
    }
    iVar1 = 2;
  }
  this->flag = iVar1;
  iVar1 = ::open(__file,iVar1);
  this->fd = iVar1;
  if (iVar1 < 0) {
    pwVar7 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar7,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)pwVar7,0x9c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"(fd = ::open(filename, flag | O_BINARY)) >= 0",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    pcVar6 = "open failed: ";
    lVar5 = 0xd;
  }
  else {
    iVar1 = fstat(iVar1,&local_b0);
    if (iVar1 < 0) {
      pwVar7 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar7,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)pwVar7,0x9f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"::fstat(fd, &st) >= 0",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      pcVar6 = "failed to get file size: ";
      lVar5 = 0x19;
    }
    else {
      this->length = local_b0.st_size;
      psVar3 = (short *)mmap((void *)0x0,local_b0.st_size,(uint)(this->flag == 2) * 2 + 1,1,this->fd
                             ,0);
      if (psVar3 != (short *)0xffffffffffffffff) {
        this->text = psVar3;
        iVar1 = ::close(this->fd);
        this->fd = -1;
        return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
      }
      pwVar7 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar7,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)pwVar7,0xaa);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 "(p = reinterpret_cast<char *> (::mmap(0, length, prot, MAP_SHARED, fd, 0))) != MAP_FAILED"
                 ,0x59);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      pcVar6 = "mmap() failed: ";
      lVar5 = 0xf;
    }
  }
LAB_0015b061:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,lVar5);
  if (__file == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar4 = strlen(__file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__file,sVar4);
  }
  return 0;
}

Assistant:

bool open(const char *filename, const char *mode = "r") {
    this->close();
    struct stat st;
    fileName = std::string(filename);

    if      (std::strcmp(mode, "r") == 0)
      flag = O_RDONLY;
    else if (std::strcmp(mode, "r+") == 0)
      flag = O_RDWR;
    else
      CHECK_FALSE(false) << "unknown open mode: " << filename;

    CHECK_FALSE((fd = ::open(filename, flag | O_BINARY)) >= 0)
        << "open failed: " << filename;

    CHECK_FALSE(::fstat(fd, &st) >= 0)
        << "failed to get file size: " << filename;

    length = st.st_size;

#ifdef HAVE_MMAP
    int prot = PROT_READ;
    if (flag == O_RDWR) prot |= PROT_WRITE;
    char *p;
    CHECK_FALSE((p = reinterpret_cast<char *>
                 (::mmap(0, length, prot, MAP_SHARED, fd, 0)))
                      != MAP_FAILED)
        << "mmap() failed: " << filename;

    text = reinterpret_cast<T *>(p);
#else
    text = new T[length];
    CHECK_FALSE(::read(fd, text, length) >= 0)
        << "read() failed: " << filename;
#endif
    ::close(fd);
    fd = -1;

    return true;
  }